

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::BasicGraphicsTestInstance::buildFrameBuffer
          (BasicGraphicsTestInstance *this,UVec2 *renderSize,VkFormat colorFormat,
          VkFormat depthFormat)

{
  deUint32 *pdVar1;
  deUint32 dVar2;
  deUint64 dVar3;
  RefData<vk::Handle<(vk::HandleType)9>_> data;
  RefData<vk::Handle<(vk::HandleType)9>_> data_00;
  RefData<vk::Handle<(vk::HandleType)13>_> data_01;
  RefData<vk::Handle<(vk::HandleType)13>_> data_02;
  RefData<vk::Handle<(vk::HandleType)23>_> data_03;
  DeviceInterface *vk_00;
  VkDevice device;
  uint *puVar4;
  Handle<(vk::HandleType)9> *pHVar5;
  Handle<(vk::HandleType)13> *pHVar6;
  Handle<(vk::HandleType)17> *pHVar7;
  Move<vk::Handle<(vk::HandleType)23>_> local_318;
  RefData<vk::Handle<(vk::HandleType)23>_> local_2f8;
  undefined1 local_2d8 [8];
  VkFramebufferCreateInfo framebufferParams;
  VkImageView attachmentBindInfos [2];
  RefData<vk::Handle<(vk::HandleType)13>_> local_268;
  undefined1 local_248 [8];
  VkImageViewCreateInfo depthAttachmentViewParams;
  RefData<vk::Handle<(vk::HandleType)13>_> local_1d8;
  undefined1 local_1b8 [8];
  VkImageViewCreateInfo colorAttachmentViewParams;
  VkImageMemoryBarrier depthImageBarrier;
  VkImageMemoryBarrier colorImageBarrier;
  RefData<vk::Handle<(vk::HandleType)9>_> local_b8;
  Move<vk::Handle<(vk::HandleType)9>_> local_88;
  RefData<vk::Handle<(vk::HandleType)9>_> local_68;
  undefined8 uStack_48;
  VkComponentMapping ComponentMappingRGBA;
  VkDevice vkDevice;
  DeviceInterface *vk;
  VkFormat depthFormat_local;
  VkFormat colorFormat_local;
  UVec2 *renderSize_local;
  BasicGraphicsTestInstance *this_local;
  
  vk_00 = Context::getDeviceInterface
                    ((this->super_TimestampTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_TimestampTestInstance).super_TestInstance.m_context);
  uStack_48._0_4_ = VK_IMAGE_VIEW_TYPE_CUBE;
  uStack_48._4_4_ = VK_FORMAT_R5G6B5_UNORM_PACK16;
  ComponentMappingRGBA.r = VK_COMPONENT_SWIZZLE_B;
  ComponentMappingRGBA.g = VK_COMPONENT_SWIZZLE_A;
  puVar4 = tcu::Vector<unsigned_int,_2>::x(renderSize);
  dVar2 = *puVar4;
  puVar4 = tcu::Vector<unsigned_int,_2>::y(renderSize);
  TimestampTestInstance::createImage2DAndBindMemory
            (&local_88,&this->super_TimestampTestInstance,colorFormat,dVar2,*puVar4,0x11,
             VK_SAMPLE_COUNT_1_BIT,&this->m_colorImageAlloc);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_68,(Move *)&local_88);
  data.deleter.m_deviceIface = local_68.deleter.m_deviceIface;
  data.object.m_internal = local_68.object.m_internal;
  data.deleter.m_device = local_68.deleter.m_device;
  data.deleter.m_allocator = local_68.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=(&this->m_colorImage,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_88);
  puVar4 = tcu::Vector<unsigned_int,_2>::x(renderSize);
  dVar2 = *puVar4;
  puVar4 = tcu::Vector<unsigned_int,_2>::y(renderSize);
  pdVar1 = &colorImageBarrier.subresourceRange.layerCount;
  TimestampTestInstance::createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)pdVar1,&this->super_TimestampTestInstance,
             depthFormat,dVar2,*puVar4,0x20,VK_SAMPLE_COUNT_1_BIT,&this->m_depthImageAlloc);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_b8,(Move *)pdVar1);
  data_00.deleter.m_deviceIface = local_b8.deleter.m_deviceIface;
  data_00.object.m_internal = local_b8.object.m_internal;
  data_00.deleter.m_device = local_b8.deleter.m_device;
  data_00.deleter.m_allocator = local_b8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=(&this->m_depthImage,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)9>_> *)&colorImageBarrier.subresourceRange.layerCount)
  ;
  colorImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorImageBarrier._4_4_ = 0;
  colorImageBarrier.pNext._0_4_ = 0;
  colorImageBarrier.pNext._4_4_ = 0x100;
  colorImageBarrier.srcAccessMask = 0;
  colorImageBarrier.dstAccessMask = 2;
  colorImageBarrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  colorImageBarrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  colorImageBarrier._32_8_ = pHVar5->m_internal;
  colorImageBarrier.image.m_internal._0_4_ = 1;
  colorImageBarrier.image.m_internal._4_4_ = 0;
  colorImageBarrier.subresourceRange.aspectMask = 1;
  colorImageBarrier.subresourceRange.baseMipLevel = 0;
  colorImageBarrier.subresourceRange.levelCount = 1;
  colorAttachmentViewParams.subresourceRange.layerCount = 0x2d;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  dVar3 = pHVar5->m_internal;
  this->m_imageLayoutBarriers[0].subresourceRange.layerCount =
       colorImageBarrier.subresourceRange.levelCount;
  this->m_imageLayoutBarriers[0].subresourceRange.aspectMask =
       (undefined4)colorImageBarrier.image.m_internal;
  this->m_imageLayoutBarriers[0].subresourceRange.baseMipLevel =
       colorImageBarrier.image.m_internal._4_4_;
  this->m_imageLayoutBarriers[0].subresourceRange.levelCount =
       colorImageBarrier.subresourceRange.aspectMask;
  this->m_imageLayoutBarriers[0].subresourceRange.baseArrayLayer =
       colorImageBarrier.subresourceRange.baseMipLevel;
  this->m_imageLayoutBarriers[0].srcQueueFamilyIndex = colorImageBarrier.oldLayout;
  this->m_imageLayoutBarriers[0].dstQueueFamilyIndex = colorImageBarrier.newLayout;
  this->m_imageLayoutBarriers[0].image.m_internal = colorImageBarrier._32_8_;
  this->m_imageLayoutBarriers[0].srcAccessMask = colorImageBarrier.pNext._0_4_;
  this->m_imageLayoutBarriers[0].dstAccessMask = colorImageBarrier.pNext._4_4_;
  this->m_imageLayoutBarriers[0].oldLayout = colorImageBarrier.srcAccessMask;
  this->m_imageLayoutBarriers[0].newLayout = colorImageBarrier.dstAccessMask;
  *(ulong *)this->m_imageLayoutBarriers = CONCAT44(depthImageBarrier._68_4_,0x2d);
  this->m_imageLayoutBarriers[0].pNext = (void *)colorImageBarrier._0_8_;
  this->m_imageLayoutBarriers[1].subresourceRange.layerCount = 1;
  this->m_imageLayoutBarriers[1].subresourceRange.aspectMask = 2;
  this->m_imageLayoutBarriers[1].subresourceRange.baseMipLevel = 0;
  this->m_imageLayoutBarriers[1].subresourceRange.levelCount = 1;
  this->m_imageLayoutBarriers[1].subresourceRange.baseArrayLayer = 0;
  this->m_imageLayoutBarriers[1].srcQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[1].dstQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[1].image.m_internal = dVar3;
  this->m_imageLayoutBarriers[1].srcAccessMask = 0;
  this->m_imageLayoutBarriers[1].dstAccessMask = 0x400;
  this->m_imageLayoutBarriers[1].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this->m_imageLayoutBarriers[1].newLayout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
  *(ulong *)(this->m_imageLayoutBarriers + 1) =
       CONCAT44(colorAttachmentViewParams._76_4_,
                colorAttachmentViewParams.subresourceRange.layerCount);
  this->m_imageLayoutBarriers[1].pNext = (void *)0x0;
  local_1b8._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  colorAttachmentViewParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentViewParams._4_4_ = 0;
  colorAttachmentViewParams.pNext._0_4_ = 0;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  colorAttachmentViewParams._16_8_ = pHVar5->m_internal;
  colorAttachmentViewParams.image.m_internal._0_4_ = 1;
  colorAttachmentViewParams.viewType = (VkImageViewType)uStack_48;
  colorAttachmentViewParams.format = uStack_48._4_4_;
  colorAttachmentViewParams.components.r = ComponentMappingRGBA.r;
  colorAttachmentViewParams.components.g = ComponentMappingRGBA.g;
  colorAttachmentViewParams.components.b = VK_COMPONENT_SWIZZLE_ZERO;
  colorAttachmentViewParams.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
  colorAttachmentViewParams.subresourceRange.aspectMask = 1;
  colorAttachmentViewParams.subresourceRange.baseMipLevel = 0;
  colorAttachmentViewParams.subresourceRange.levelCount = 1;
  pdVar1 = &depthAttachmentViewParams.subresourceRange.layerCount;
  colorAttachmentViewParams.image.m_internal._4_4_ = colorFormat;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)pdVar1,vk_00,device,
             (VkImageViewCreateInfo *)local_1b8,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1d8,(Move *)pdVar1);
  data_01.deleter.m_deviceIface = local_1d8.deleter.m_deviceIface;
  data_01.object.m_internal = local_1d8.object.m_internal;
  data_01.deleter.m_device = local_1d8.deleter.m_device;
  data_01.deleter.m_allocator = local_1d8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=
            (&this->m_colorAttachmentView,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)13>_> *)
             &depthAttachmentViewParams.subresourceRange.layerCount);
  local_248._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  depthAttachmentViewParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthAttachmentViewParams._4_4_ = 0;
  depthAttachmentViewParams.pNext._0_4_ = 0;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  depthAttachmentViewParams._16_8_ = pHVar5->m_internal;
  depthAttachmentViewParams.image.m_internal._0_4_ = 1;
  depthAttachmentViewParams.viewType = (VkImageViewType)uStack_48;
  depthAttachmentViewParams.format = uStack_48._4_4_;
  depthAttachmentViewParams.components.r = ComponentMappingRGBA.r;
  depthAttachmentViewParams.components.g = ComponentMappingRGBA.g;
  depthAttachmentViewParams.components.b = VK_COMPONENT_SWIZZLE_ONE;
  depthAttachmentViewParams.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
  depthAttachmentViewParams.subresourceRange.aspectMask = 1;
  depthAttachmentViewParams.subresourceRange.baseMipLevel = 0;
  depthAttachmentViewParams.subresourceRange.levelCount = 1;
  depthAttachmentViewParams.image.m_internal._4_4_ = depthFormat;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)(attachmentBindInfos + 1),vk_00,device,
             (VkImageViewCreateInfo *)local_248,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_268,(Move *)(attachmentBindInfos + 1));
  data_02.deleter.m_deviceIface = local_268.deleter.m_deviceIface;
  data_02.object.m_internal = local_268.object.m_internal;
  data_02.deleter.m_device = local_268.deleter.m_device;
  data_02.deleter.m_allocator = local_268.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=
            (&this->m_depthAttachmentView,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)13>_> *)(attachmentBindInfos + 1));
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                     (&(this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>)
  ;
  framebufferParams._56_8_ = pHVar6->m_internal;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                     (&(this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>)
  ;
  attachmentBindInfos[0].m_internal = pHVar6->m_internal;
  local_2d8._0_4_ = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  framebufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  framebufferParams._4_4_ = 0;
  framebufferParams.pNext._0_4_ = 0;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  framebufferParams._16_8_ = pHVar7->m_internal;
  framebufferParams.renderPass.m_internal._0_4_ = 2;
  framebufferParams._32_8_ = &framebufferParams.layers;
  puVar4 = tcu::Vector<unsigned_int,_2>::x(renderSize);
  framebufferParams.pAttachments._0_4_ = *puVar4;
  puVar4 = tcu::Vector<unsigned_int,_2>::y(renderSize);
  framebufferParams.pAttachments._4_4_ = *puVar4;
  framebufferParams.width = 1;
  ::vk::createFramebuffer
            (&local_318,vk_00,device,(VkFramebufferCreateInfo *)local_2d8,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2f8,(Move *)&local_318);
  data_03.deleter.m_deviceIface = local_2f8.deleter.m_deviceIface;
  data_03.object.m_internal = local_2f8.object.m_internal;
  data_03.deleter.m_device = local_2f8.deleter.m_device;
  data_03.deleter.m_allocator = local_2f8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::operator=(&this->m_framebuffer,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_318);
  return;
}

Assistant:

void BasicGraphicsTestInstance::buildFrameBuffer(tcu::UVec2 renderSize, VkFormat colorFormat, VkFormat depthFormat)
{
	const DeviceInterface&      vk                   = m_context.getDeviceInterface();
	const VkDevice              vkDevice             = m_context.getDevice();
	const VkComponentMapping    ComponentMappingRGBA = { VK_COMPONENT_SWIZZLE_R, VK_COMPONENT_SWIZZLE_G, VK_COMPONENT_SWIZZLE_B, VK_COMPONENT_SWIZZLE_A};

	// Create color image
	{
		m_colorImage = createImage2DAndBindMemory(colorFormat,
												  renderSize.x(),
												  renderSize.y(),
												  VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
												  VK_SAMPLE_COUNT_1_BIT,
												  &m_colorImageAlloc);
	}

	// Create depth image
	{
		m_depthImage = createImage2DAndBindMemory(depthFormat,
												  renderSize.x(),
												  renderSize.y(),
												  VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT,
												  VK_SAMPLE_COUNT_1_BIT,
												  &m_depthImageAlloc);
	}

	// Set up image layout transition barriers
	{
		const VkImageMemoryBarrier colorImageBarrier =
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
			DE_NULL,											// const void*				pNext;
			0u,													// VkAccessFlags			srcAccessMask;
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,				// VkAccessFlags			dstAccessMask;
			VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout			oldLayout;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,			// VkImageLayout			newLayout;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					dstQueueFamilyIndex;
			*m_colorImage,										// VkImage					image;
			{ VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u },		// VkImageSubresourceRange	subresourceRange;
		};
		const VkImageMemoryBarrier depthImageBarrier =
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
			DE_NULL,											// const void*				pNext;
			0u,													// VkAccessFlags			srcAccessMask;
			VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT,		// VkAccessFlags			dstAccessMask;
			VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout			oldLayout;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,	// VkImageLayout			newLayout;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					dstQueueFamilyIndex;
			*m_depthImage,										// VkImage					image;
			{ VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 1u, 0u, 1u },		// VkImageSubresourceRange	subresourceRange;
		};

		m_imageLayoutBarriers[0] = colorImageBarrier;
		m_imageLayoutBarriers[1] = depthImageBarrier;
	}

	// Create color attachment view
	{
		const VkImageViewCreateInfo colorAttachmentViewParams =
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,       // VkStructureType          sType;
			DE_NULL,                                        // const void*              pNext;
			0u,                                             // VkImageViewCreateFlags   flags;
			*m_colorImage,                                  // VkImage                  image;
			VK_IMAGE_VIEW_TYPE_2D,                          // VkImageViewType          viewType;
			colorFormat,                                    // VkFormat                 format;
			ComponentMappingRGBA,                           // VkComponentMapping       components;
			{ VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u },  // VkImageSubresourceRange  subresourceRange;
		};

		m_colorAttachmentView = createImageView(vk, vkDevice, &colorAttachmentViewParams);
	}

	// Create depth attachment view
	{
		const VkImageViewCreateInfo depthAttachmentViewParams =
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,       // VkStructureType          sType;
			DE_NULL,                                        // const void*              pNext;
			0u,                                             // VkImageViewCreateFlags   flags;
			*m_depthImage,                                  // VkImage                  image;
			VK_IMAGE_VIEW_TYPE_2D,                          // VkImageViewType          viewType;
			depthFormat,                                    // VkFormat                 format;
			ComponentMappingRGBA,                           // VkComponentMapping       components;
			{ VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 1u, 0u, 1u },  // VkImageSubresourceRange  subresourceRange;
		};

		m_depthAttachmentView = createImageView(vk, vkDevice, &depthAttachmentViewParams);
	}

	// Create framebuffer
	{
		const VkImageView attachmentBindInfos[2] =
		{
			*m_colorAttachmentView,
			*m_depthAttachmentView,
		};

		const VkFramebufferCreateInfo framebufferParams =
		{
			VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,          // VkStructureType              sType;
			DE_NULL,                                            // const void*                  pNext;
			0u,                                                 // VkFramebufferCreateFlags     flags;
			*m_renderPass,                                      // VkRenderPass                 renderPass;
			2u,                                                 // deUint32                     attachmentCount;
			attachmentBindInfos,                                // const VkImageView*           pAttachments;
			(deUint32)renderSize.x(),                           // deUint32                     width;
			(deUint32)renderSize.y(),                           // deUint32                     height;
			1u,                                                 // deUint32                     layers;
		};

		m_framebuffer = createFramebuffer(vk, vkDevice, &framebufferParams);
	}

}